

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

void __thiscall cxxopts::OptionException::OptionException(OptionException *this,string *message)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__OptionException_0013aeb0;
  (this->m_message)._M_dataplus._M_p = (pointer)&(this->m_message).field_2;
  pcVar1 = (message->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_message,pcVar1,pcVar1 + message->_M_string_length);
  return;
}

Assistant:

OptionException(const std::string& message)
                : m_message(message)
        {
        }